

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O0

void __thiscall
spoa::SisdAlignmentEngine::Realloc
          (SisdAlignmentEngine *this,uint64_t matrix_width,uint64_t matrix_height,uint8_t num_codes)

{
  int32_t *piVar1;
  pointer pIVar2;
  size_type sVar3;
  int *piVar4;
  long lVar5;
  value_type_conflict3 local_38 [5];
  byte local_21;
  uint64_t uStack_20;
  uint8_t num_codes_local;
  uint64_t matrix_height_local;
  uint64_t matrix_width_local;
  SisdAlignmentEngine *this_local;
  
  local_21 = num_codes;
  uStack_20 = matrix_height;
  matrix_height_local = matrix_width;
  matrix_width_local = (uint64_t)this;
  pIVar2 = std::
           unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
           ::operator->(&this->pimpl_);
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&pIVar2->node_id_to_rank);
  if (sVar3 < uStack_20 - 1) {
    pIVar2 = std::
             unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ::operator->(&this->pimpl_);
    local_38[4] = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&pIVar2->node_id_to_rank,uStack_20 - 1,(value_type_conflict1 *)(local_38 + 4));
  }
  pIVar2 = std::
           unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
           ::operator->(&this->pimpl_);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&pIVar2->sequence_profile);
  if (sVar3 < local_21 * matrix_height_local) {
    pIVar2 = std::
             unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ::operator->(&this->pimpl_);
    local_38[3] = 0;
    std::vector<int,_std::allocator<int>_>::resize
              (&pIVar2->sequence_profile,local_21 * matrix_height_local,local_38 + 3);
  }
  if ((this->super_AlignmentEngine).subtype_ == kLinear) {
    pIVar2 = std::
             unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ::operator->(&this->pimpl_);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&pIVar2->M);
    if (sVar3 < uStack_20 * matrix_height_local) {
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      local_38[2] = 0;
      std::vector<int,_std::allocator<int>_>::resize
                (&pIVar2->M,matrix_height_local * uStack_20,local_38 + 2);
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      piVar4 = std::vector<int,_std::allocator<int>_>::data(&pIVar2->M);
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      pIVar2->H = piVar4;
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      pIVar2->F = (int32_t *)0x0;
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      pIVar2->E = (int32_t *)0x0;
    }
  }
  else if ((this->super_AlignmentEngine).subtype_ == kAffine) {
    pIVar2 = std::
             unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ::operator->(&this->pimpl_);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&pIVar2->M);
    if (sVar3 < uStack_20 * 3 * matrix_height_local) {
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      local_38[1] = 0;
      std::vector<int,_std::allocator<int>_>::resize
                (&pIVar2->M,matrix_height_local * 3 * uStack_20,local_38 + 1);
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      piVar4 = std::vector<int,_std::allocator<int>_>::data(&pIVar2->M);
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      pIVar2->H = piVar4;
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      piVar1 = pIVar2->H;
      lVar5 = matrix_height_local * uStack_20;
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      pIVar2->F = piVar1 + lVar5;
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      piVar1 = pIVar2->F;
      lVar5 = matrix_height_local * uStack_20;
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      pIVar2->E = piVar1 + lVar5;
    }
  }
  else if ((this->super_AlignmentEngine).subtype_ == kConvex) {
    pIVar2 = std::
             unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ::operator->(&this->pimpl_);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&pIVar2->M);
    if (sVar3 < uStack_20 * 5 * matrix_height_local) {
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      local_38[0] = 0;
      std::vector<int,_std::allocator<int>_>::resize
                (&pIVar2->M,matrix_height_local * 5 * uStack_20,local_38);
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      piVar4 = std::vector<int,_std::allocator<int>_>::data(&pIVar2->M);
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      pIVar2->H = piVar4;
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      piVar1 = pIVar2->H;
      lVar5 = matrix_height_local * uStack_20;
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      pIVar2->F = piVar1 + lVar5;
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      piVar1 = pIVar2->F;
      lVar5 = matrix_height_local * uStack_20;
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      pIVar2->E = piVar1 + lVar5;
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      piVar1 = pIVar2->E;
      lVar5 = matrix_height_local * uStack_20;
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      pIVar2->O = piVar1 + lVar5;
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      piVar1 = pIVar2->O;
      lVar5 = matrix_height_local * uStack_20;
      pIVar2 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      pIVar2->Q = piVar1 + lVar5;
    }
  }
  return;
}

Assistant:

void SisdAlignmentEngine::Realloc(
    std::uint64_t matrix_width,
    std::uint64_t matrix_height,
    std::uint8_t num_codes) {
  if (pimpl_->node_id_to_rank.size() < matrix_height - 1) {
    pimpl_->node_id_to_rank.resize(matrix_height - 1, 0);
  }
  if (pimpl_->sequence_profile.size() < num_codes * matrix_width) {
    pimpl_->sequence_profile.resize(num_codes * matrix_width, 0);
  }
  if (subtype_ == AlignmentSubtype::kLinear) {
    if (pimpl_->M.size() < matrix_height * matrix_width) {
      pimpl_->M.resize(matrix_width * matrix_height, 0);
      pimpl_->H = pimpl_->M.data();
      pimpl_->F = nullptr;
      pimpl_->E = nullptr;
    }
  } else if (subtype_ == AlignmentSubtype::kAffine) {
    if (pimpl_->M.size() < 3 * matrix_height * matrix_width) {
      pimpl_->M.resize(3 * matrix_width * matrix_height, 0);
      pimpl_->H = pimpl_->M.data();
      pimpl_->F = pimpl_->H + matrix_width * matrix_height;
      pimpl_->E = pimpl_->F + matrix_width * matrix_height;
    }
  } else if (subtype_ == AlignmentSubtype::kConvex) {
    if (pimpl_->M.size() < 5 * matrix_height * matrix_width) {
      pimpl_->M.resize(5 * matrix_width * matrix_height, 0);
      pimpl_->H = pimpl_->M.data();
      pimpl_->F = pimpl_->H + matrix_width * matrix_height;
      pimpl_->E = pimpl_->F + matrix_width * matrix_height;
      pimpl_->O = pimpl_->E + matrix_width * matrix_height;
      pimpl_->Q = pimpl_->O + matrix_width * matrix_height;
    }
  }
}